

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int ffkeyn(char *keyroot,int value,char *keyname,int *status)

{
  size_t sVar1;
  size_t sVar2;
  char suffix [16];
  char acStack_38 [16];
  
  *keyname = '\0';
  sVar1 = strlen(keyroot);
  if (-1 < value && sVar1 != 0) {
    snprintf(acStack_38,0x10,"%d",value);
    strcpy(keyname,keyroot);
    do {
      if (keyname[sVar1 - 1] != ' ') break;
      keyname[sVar1 - 1] = '\0';
      sVar1 = sVar1 - 1;
    } while (sVar1 != 0);
    sVar1 = strlen(acStack_38);
    sVar2 = strlen(keyname);
    if (sVar2 + sVar1 < 9) {
      strcat(keyname,acStack_38);
      return *status;
    }
  }
  *status = 0xce;
  return 0xce;
}

Assistant:

int ffkeyn(const char *keyroot,   /* I - root string for keyword name */
           int value,       /* I - index number to be appended to root name */
           char *keyname,   /* O - output root + index keyword name */
           int *status)     /* IO - error status  */
/*
  Construct a keyword name string by appending the index number to the root.
  e.g., if root = "TTYPE" and value = 12 then keyname = "TTYPE12".
*/
{
    char suffix[16];
    size_t rootlen;

    keyname[0] = '\0';            /* initialize output name to null */
    rootlen = strlen(keyroot);

    if (rootlen == 0 || value < 0 )
       return(*status = 206);

    snprintf(suffix, 16, "%d", value); /* construct keyword suffix */

    strcpy(keyname, keyroot);   /* copy root string to name string */
    while (rootlen > 0 && keyname[rootlen - 1] == ' ') {
        rootlen--;                 /* remove trailing spaces in root name */
        keyname[rootlen] = '\0';
    }
    if (strlen(suffix) + strlen(keyname) > 8)
       return (*status=206);
       
    strcat(keyname, suffix);    /* append suffix to the root */
    return(*status);
}